

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab5.c
# Opt level: O0

int CheckDecompress(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int local_24;
  int passed;
  size_t outputLength;
  FILE *out;
  
  __stream = fopen("out.txt","rb");
  if (__stream == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    TestN = TestN + 1;
    out._4_4_ = -1;
  }
  else {
    sVar2 = fread(LabOutput,1,InputLength + 1,__stream);
    fclose(__stream);
    local_24 = CheckSame((int)sVar2,(int)InputLength);
    if (local_24 != 0) {
      iVar1 = memcmp(LabOutput,Input,InputLength);
      if (iVar1 != 0) {
        local_24 = 0;
        printf("output is wrong -- ");
      }
    }
    if (local_24 == 0) {
      printf("FAILED\n");
      TestN = TestN + 1;
      out._4_4_ = 1;
    }
    else {
      printf("PASSED\n");
      TestN = TestN + 1;
      out._4_4_ = 0;
    }
  }
  return out._4_4_;
}

Assistant:

static int CheckDecompress(void) {
    FILE *const out = fopen("out.txt", "rb");
    if (!out) {
        printf("can't open out.txt\n");
        TestN++;
        return -1;
    }
    const size_t outputLength = fread(LabOutput, 1, InputLength+1, out);
    fclose(out);
    int passed = CheckSame(outputLength, InputLength);
    if (passed && memcmp(LabOutput, Input, InputLength) != 0) {
        passed = 0;
        printf("output is wrong -- ");
    }
    if (passed) {
        printf("PASSED\n");
        TestN++;
        return 0;
    } else {
        printf("FAILED\n");
        TestN++;
        return 1;
    }
}